

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O1

void __thiscall crnlib::random::seed(random *this,uint32 i1,uint32 i2,uint32 i3)

{
  int iVar1;
  
  ranctx::seed(&this->m_ranctx,i2 ^ i1 ^ i3);
  (this->m_kiss99).x = i1;
  (this->m_kiss99).y = i2;
  (this->m_kiss99).z = i3;
  (this->m_kiss99).c = 0x74cbb1;
  well512::seed(&this->m_well512,i1,i2,i3);
  iVar1 = 100;
  do {
    urand32(this);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void random::seed(uint32 i1, uint32 i2, uint32 i3)
    {
        m_ranctx.seed(i1 ^ i2 ^ i3);

        m_kiss99.seed(i1, i2, i3);

        m_well512.seed(i1, i2, i3);

        for (uint i = 0; i < 100; i++)
        {
            urand32();
        }
    }